

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_context_get_device_info_enum_callback__alsa
                    (ma_context *pContext,ma_device_type deviceType,ma_device_info *pDeviceInfo,
                    void *pUserData)

{
  ma_bool32 mVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  ma_uint8 mVar5;
  ma_device_id *pmVar6;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pData != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x41f3,
                  "ma_bool32 ma_context_get_device_info_enum_callback__alsa(ma_context *, ma_device_type, const ma_device_info *, void *)"
                 );
  }
  if (*(ma_device_id **)((long)pUserData + 8) == (ma_device_id *)0x0) {
    pcVar4 = "default";
    if (pDeviceInfo != (ma_device_info *)"default") {
      if (pDeviceInfo != (ma_device_info *)0x0) {
        mVar5 = (pDeviceInfo->id).dsound[0];
        if (mVar5 != '\0') {
          pmVar6 = &pDeviceInfo->id;
          pcVar4 = "default";
          do {
            pmVar6 = (ma_device_id *)(pmVar6->dsound + 1);
            if (mVar5 != *pcVar4) break;
            pcVar4 = (char *)((ma_uint8 *)pcVar4 + 1);
            mVar5 = pmVar6->dsound[0];
          } while (mVar5 != '\0');
        }
        if (mVar5 == *pcVar4) goto LAB_001071c4;
      }
      goto LAB_0010714c;
    }
LAB_001071c4:
    lVar2 = *(long *)((long)pUserData + 0x18) + 0x100;
    lVar3 = 0;
    do {
      if (pDeviceInfo->name[lVar3] == '\0') goto LAB_001071ef;
      *(char *)(lVar2 + lVar3) = pDeviceInfo->name[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xff);
  }
  else {
LAB_0010714c:
    if ((*pUserData != deviceType) ||
       (mVar1 = ma_context_is_device_id_equal__alsa
                          (pContext,*(ma_device_id **)((long)pUserData + 8),&pDeviceInfo->id),
       mVar1 == 0)) goto LAB_001071fc;
    lVar2 = *(long *)((long)pUserData + 0x18) + 0x100;
    lVar3 = 0;
    do {
      if (pDeviceInfo->name[lVar3] == '\0') goto LAB_001071ef;
      *(char *)(lVar2 + lVar3) = pDeviceInfo->name[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xff);
  }
  lVar3 = 0xff;
LAB_001071ef:
  *(undefined1 *)(lVar2 + lVar3) = 0;
  *(undefined4 *)((long)pUserData + 0x20) = 1;
LAB_001071fc:
  return (ma_bool32)(*(int *)((long)pUserData + 0x20) == 0);
}

Assistant:

static ma_bool32 ma_context_get_device_info_enum_callback__alsa(ma_context* pContext, ma_device_type deviceType, const ma_device_info* pDeviceInfo, void* pUserData)
{
    ma_context_get_device_info_enum_callback_data__alsa* pData = (ma_context_get_device_info_enum_callback_data__alsa*)pUserData;
    MA_ASSERT(pData != NULL);

    if (pData->pDeviceID == NULL && ma_strcmp(pDeviceInfo->id.alsa, "default") == 0) {
        ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pDeviceInfo->name, (size_t)-1);
        pData->foundDevice = MA_TRUE;
    } else {
        if (pData->deviceType == deviceType && ma_context_is_device_id_equal__alsa(pContext, pData->pDeviceID, &pDeviceInfo->id)) {
            ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pDeviceInfo->name, (size_t)-1);
            pData->foundDevice = MA_TRUE;
        }
    }

    /* Keep enumerating until we have found the device. */
    return !pData->foundDevice;
}